

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fchmod_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req->fs_type != UV_FS_FCHMOD) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x102,"req->fs_type == UV_FS_FCHMOD");
    abort();
  }
  if (req->result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x103,"req->result == 0");
    abort();
  }
  fchmod_cb_count = fchmod_cb_count + 1;
  uv_fs_req_cleanup(req);
  check_permission("test_file",*req->data);
  return;
}

Assistant:

static void fchmod_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_FCHMOD);
  ASSERT(req->result == 0);
  fchmod_cb_count++;
  uv_fs_req_cleanup(req);
  check_permission("test_file", *(int*)req->data);
}